

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::Commissioner::GeneratePSKc
                  (Error *__return_storage_ptr__,ByteArray *aPSKc,string *aPassphrase,
                  string *aNetworkName,ByteArray *aExtendedPanId)

{
  uint16_t aPasswordLen;
  ulong uVar1;
  size_type sVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  uint8_t *aPassword;
  uchar *aSalt;
  size_type sVar3;
  uchar *aKey;
  ByteArray *args_2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_490;
  const_iterator local_488;
  uchar *local_480;
  uchar *local_478;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_470;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_468;
  const_iterator local_460;
  uchar *local_458;
  char *local_450;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_448;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_440;
  const_iterator local_438;
  size_type local_430;
  anon_class_1_0_00000001 local_422;
  v10 local_421;
  v10 *local_420;
  char *local_418;
  string local_410;
  Error local_3f0;
  undefined8 local_3c8;
  anon_class_1_0_00000001 local_3ba;
  v10 local_3b9;
  v10 *local_3b8;
  char *local_3b0;
  string local_3a8;
  Error local_388;
  undefined8 local_360;
  anon_class_1_0_00000001 local_352;
  v10 local_351;
  v10 *local_350;
  char *local_348;
  string local_340;
  Error local_320;
  undefined1 local_2f8 [8];
  ByteArray salt;
  allocator local_2c9;
  string local_2c8 [8];
  string saltPrefix;
  ByteArray *aExtendedPanId_local;
  string *aNetworkName_local;
  string *aPassphrase_local;
  ByteArray *aPSKc_local;
  Error *error;
  undefined1 local_248 [16];
  v10 *local_238;
  char *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  v10 *local_218;
  v10 *local_210;
  char *pcStack_208;
  string *local_200;
  v10 *local_1f8;
  v10 **local_1f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_long>
  local_1e8;
  undefined1 local_1c0 [16];
  v10 *local_1b0;
  char *local_1a8;
  undefined8 *local_1a0;
  v10 *local_198;
  v10 *local_190;
  char *pcStack_188;
  string *local_180;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_long>
  local_178;
  undefined1 local_158 [16];
  v10 *local_148;
  char *local_140;
  undefined8 *local_138;
  v10 *local_130;
  v10 *local_128;
  char *pcStack_120;
  string *local_118;
  v10 *local_110;
  v10 **local_108;
  v10 *local_100;
  v10 **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  char *pcStack_e0;
  Error **local_d0;
  undefined1 *local_c8;
  Error **local_c0;
  Error **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  v10 **local_a0;
  v10 *local_98;
  char *pcStack_90;
  v10 **local_80;
  v10 *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_long>
  *local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_long>
  *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_long>
  *local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_long>
  *local_30;
  undefined8 local_28;
  undefined1 *local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_long>
  *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_long>
  *local_10;
  
  saltPrefix.field_2._M_local_buf[0xf] = '\0';
  args_2 = aExtendedPanId;
  Error::Error(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"Thread",&local_2c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2f8);
  uVar1 = std::__cxx11::string::size();
  if (5 < uVar1) {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 < 0x100) {
      uVar1 = std::__cxx11::string::size();
      if (uVar1 < 0x11) {
        sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aExtendedPanId);
        if (sVar2 == 8) {
          local_440._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_2f8);
          __gnu_cxx::
          __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::__normal_iterator<unsigned_char*>
                    ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)&local_438,&local_440);
          local_448._M_current = (char *)std::__cxx11::string::begin();
          local_450 = (char *)std::__cxx11::string::end();
          local_458 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                               insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                                         ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                          local_2f8,local_438,local_448,
                                          (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           )local_450);
          local_468._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_2f8);
          __gnu_cxx::
          __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::__normal_iterator<unsigned_char*>
                    ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)&local_460,&local_468);
          local_470._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  (aExtendedPanId);
          local_478 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                         (aExtendedPanId);
          local_480 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                               insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                         ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                          local_2f8,local_460,local_470,
                                          (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                           )local_478);
          local_490._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_2f8);
          __gnu_cxx::
          __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::__normal_iterator<unsigned_char*>
                    ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)&local_488,&local_490);
          __first._M_current = (char *)std::__cxx11::string::begin();
          __last._M_current = (char *)std::__cxx11::string::end();
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_2f8,local_488,
                     __first,__last);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(aPSKc,0x10);
          aPassword = (uint8_t *)std::__cxx11::string::data();
          aPasswordLen = std::__cxx11::string::size();
          aSalt = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2f8);
          sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2f8);
          sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aPSKc);
          aKey = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(aPSKc);
          otPbkdf2Cmac(aPassword,aPasswordLen,aSalt,(uint16_t)sVar2,0x4000,(uint16_t)sVar3,aKey);
        }
        else {
          GeneratePSKc::anon_class_1_0_00000001::operator()(&local_422);
          local_f8 = &local_420;
          local_100 = &local_421;
          bVar4 = ::fmt::v10::operator()(local_100);
          local_418 = (char *)bVar4.size_;
          local_420 = (v10 *)bVar4.data_;
          ::fmt::v10::detail::
          check_format_string<unsigned_long,_const_unsigned_long_&,_FMT_COMPILE_STRING,_0>();
          local_430 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                (aExtendedPanId);
          local_180 = &local_410;
          local_190 = local_420;
          pcStack_188 = local_418;
          local_198 = (v10 *)&local_430;
          local_1a0 = &kExtendedPanIdLength;
          local_80 = &local_190;
          local_1b0 = local_420;
          local_1a8 = local_418;
          local_78 = local_1b0;
          pcStack_70 = local_1a8;
          ::fmt::v10::
          make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_long,unsigned_long_const>
                    (&local_1e8,local_198,&kExtendedPanIdLength,(unsigned_long *)local_420);
          local_38 = local_1c0;
          local_40 = &local_1e8;
          local_28 = 0x44;
          fmt_01.size_ = 0x44;
          fmt_01.data_ = local_1a8;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)local_40;
          local_30 = local_40;
          local_20 = local_38;
          local_18 = local_40;
          ::fmt::v10::vformat_abi_cxx11_(&local_410,local_1b0,fmt_01,args_01);
          Error::Error(&local_3f0,kInvalidArgs,&local_410);
          Error::operator=(__return_storage_ptr__,&local_3f0);
          Error::~Error(&local_3f0);
          std::__cxx11::string::~string((string *)&local_410);
        }
      }
      else {
        GeneratePSKc::anon_class_1_0_00000001::operator()(&local_3ba);
        local_108 = &local_3b8;
        local_110 = &local_3b9;
        bVar4 = ::fmt::v10::operator()(local_110);
        local_3b0 = (char *)bVar4.size_;
        local_3b8 = (v10 *)bVar4.data_;
        ::fmt::v10::detail::
        check_format_string<unsigned_long,_const_unsigned_long_&,_FMT_COMPILE_STRING,_0>();
        local_3c8 = std::__cxx11::string::size();
        local_118 = &local_3a8;
        local_128 = local_3b8;
        pcStack_120 = local_3b0;
        local_130 = (v10 *)&local_3c8;
        local_138 = &kMaxNetworkNameLength;
        local_a0 = &local_128;
        local_148 = local_3b8;
        local_140 = local_3b0;
        local_98 = local_148;
        pcStack_90 = local_140;
        ::fmt::v10::
        make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_long,unsigned_long_const>
                  (&local_178,local_130,&kMaxNetworkNameLength,(unsigned_long *)local_3b8);
        local_60 = local_158;
        local_68 = &local_178;
        local_50 = 0x44;
        fmt_00.size_ = 0x44;
        fmt_00.data_ = local_140;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_68;
        local_58 = local_68;
        local_48 = local_60;
        local_10 = local_68;
        ::fmt::v10::vformat_abi_cxx11_(&local_3a8,local_148,fmt_00,args_00);
        Error::Error(&local_388,kInvalidArgs,&local_3a8);
        Error::operator=(__return_storage_ptr__,&local_388);
        Error::~Error(&local_388);
        std::__cxx11::string::~string((string *)&local_3a8);
      }
      goto LAB_0026074f;
    }
  }
  GeneratePSKc::anon_class_1_0_00000001::operator()(&local_352);
  local_1f0 = &local_350;
  local_1f8 = &local_351;
  bVar4 = ::fmt::v10::operator()(local_1f8);
  local_348 = (char *)bVar4.size_;
  local_350 = (v10 *)bVar4.data_;
  ::fmt::v10::detail::
  check_format_string<unsigned_long,_const_unsigned_long_&,_const_unsigned_long_&,_FMT_COMPILE_STRING,_0>
            ();
  local_360 = std::__cxx11::string::size();
  local_200 = &local_340;
  local_210 = local_350;
  pcStack_208 = local_348;
  local_218 = (v10 *)&local_360;
  local_220 = &kMinCommissionerCredentialLength;
  local_228 = &kMaxCommissionerCredentialLength;
  local_f0 = &local_210;
  local_238 = local_350;
  local_230 = local_348;
  local_e8 = local_238;
  pcStack_e0 = local_230;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_long,unsigned_long_const,unsigned_long_const>
            ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_long,_unsigned_long>
              *)&error,local_218,&kMinCommissionerCredentialLength,&kMaxCommissionerCredentialLength
             ,(unsigned_long *)args_2);
  local_c8 = local_248;
  local_d0 = &error;
  local_b0 = 0x444;
  fmt.size_ = 0x444;
  fmt.data_ = local_230;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_d0;
  local_c0 = local_d0;
  local_b8 = local_d0;
  local_a8 = local_c8;
  ::fmt::v10::vformat_abi_cxx11_(&local_340,local_238,fmt,args);
  Error::Error(&local_320,kInvalidArgs,&local_340);
  Error::operator=(__return_storage_ptr__,&local_320);
  Error::~Error(&local_320);
  std::__cxx11::string::~string((string *)&local_340);
LAB_0026074f:
  saltPrefix.field_2._M_local_buf[0xf] = '\x01';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2f8);
  std::__cxx11::string::~string(local_2c8);
  if ((saltPrefix.field_2._M_local_buf[0xf] & 1U) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Commissioner::GeneratePSKc(ByteArray         &aPSKc,
                                 const std::string &aPassphrase,
                                 const std::string &aNetworkName,
                                 const ByteArray   &aExtendedPanId)
{
    Error             error;
    const std::string saltPrefix = "Thread";
    ByteArray         salt;

    VerifyOrExit((aPassphrase.size() >= kMinCommissionerCredentialLength) &&
                     (aPassphrase.size() <= kMaxCommissionerCredentialLength),
                 error = ERROR_INVALID_ARGS("passphrase length={} exceeds range [{}, {}]", aPassphrase.size(),
                                            kMinCommissionerCredentialLength, kMaxCommissionerCredentialLength));
    VerifyOrExit(aNetworkName.size() <= kMaxNetworkNameLength,
                 error = ERROR_INVALID_ARGS("network name length={} > {}", aNetworkName.size(), kMaxNetworkNameLength));
    VerifyOrExit(
        aExtendedPanId.size() == kExtendedPanIdLength,
        error = ERROR_INVALID_ARGS("extended PAN ID length={} != {}", aExtendedPanId.size(), kExtendedPanIdLength));

    salt.insert(salt.end(), saltPrefix.begin(), saltPrefix.end());
    salt.insert(salt.end(), aExtendedPanId.begin(), aExtendedPanId.end());
    salt.insert(salt.end(), aNetworkName.begin(), aNetworkName.end());

    aPSKc.resize(kMaxPSKcLength);
    otPbkdf2Cmac(reinterpret_cast<const uint8_t *>(aPassphrase.data()), static_cast<uint16_t>(aPassphrase.size()),
                 salt.data(), static_cast<uint16_t>(salt.size()), 16384, static_cast<uint16_t>(aPSKc.size()),
                 aPSKc.data());

exit:
    return error;
}